

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

TPZFMatrix<std::complex<float>_> * __thiscall
TPZFMatrix<std::complex<float>_>::operator=
          (TPZFMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *A)

{
  complex<float> *pcVar1;
  
  TPZMatrix<std::complex<float>_>::operator=
            (&this->super_TPZMatrix<std::complex<float>_>,&A->super_TPZMatrix<std::complex<float>_>)
  ;
  pcVar1 = A->fGiven;
  this->fElem = A->fElem;
  this->fGiven = pcVar1;
  this->fSize = A->fSize;
  TPZManVector<int,_5>::operator=(&this->fPivot,&A->fPivot);
  TPZVec<std::complex<float>_>::operator=(&this->fWork,&A->fWork);
  A->fElem = (complex<float> *)0x0;
  A->fGiven = (complex<float> *)0x0;
  A->fSize = 0;
  return this;
}

Assistant:

TPZFMatrix<TVar> &TPZFMatrix<TVar>::operator=(TPZFMatrix<TVar> &&A ) {
    TPZMatrix<TVar>::operator=(A);
    fElem=A.fElem;
    fGiven=A.fGiven;
    fSize=A.fSize;
    fPivot = A.fPivot;
    fWork = A.fWork;
    
    A.fElem = nullptr;
    A.fGiven = nullptr;
    A.fSize = 0;
    return *this;
}